

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O3

bool bssl::anon_unknown_1::VerifyNameMatchInternal(Input a,Input b,NameMatchType match_type)

{
  pointer __src;
  X509NameAttribute attribute;
  X509NameAttribute attribute_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer __dest;
  pointer pXVar4;
  RelativeDistinguishedName b_type_and_values;
  string b_normalized;
  string a_normalized;
  RelativeDistinguishedName a_type_and_values;
  Parser a_rdn_sequence;
  Parser b_rdn_sequence;
  Parser a_rdn;
  Parser b_rdn_sequence_counter;
  Parser a_rdn_sequence_counter;
  Parser b_rdn;
  RelativeDistinguishedName local_218;
  string local_1f8;
  string local_1d8;
  RelativeDistinguishedName local_1b8;
  uchar *local_198;
  size_t sStack_190;
  undefined8 local_188;
  uchar *puStack_180;
  size_t local_178;
  pointer local_168;
  Parser local_160;
  uchar *local_148;
  size_t sStack_140;
  undefined8 local_138;
  uchar *puStack_130;
  size_t local_128;
  uchar *local_118;
  size_t sStack_110;
  undefined8 local_108;
  uchar *puStack_100;
  size_t local_f8;
  Parser local_f0;
  Parser local_d8;
  Parser local_c0;
  Parser local_a8;
  CertErrors local_90;
  uchar *local_78;
  size_t sStack_70;
  undefined8 local_68;
  uchar *puStack_60;
  size_t local_58;
  Parser local_48;
  
  bssl::der::Parser::Parser(&local_a8,a);
  bssl::der::Parser::Parser(&local_c0,b);
  while ((bVar1 = bssl::der::Parser::HasMore(&local_a8), bVar1 &&
         (bVar1 = bssl::der::Parser::HasMore(&local_c0), bVar1))) {
    bVar1 = bssl::der::Parser::SkipTag(&local_a8,0x20000011);
    if (!bVar1) {
      return false;
    }
    bVar1 = bssl::der::Parser::SkipTag(&local_c0,0x20000011);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = bssl::der::Parser::HasMore(&local_c0);
  if (bVar1) {
    return false;
  }
  if ((match_type == EXACT_MATCH) && (bVar1 = bssl::der::Parser::HasMore(&local_a8), bVar1)) {
    return false;
  }
  bssl::der::Parser::Parser(&local_160,a);
  bssl::der::Parser::Parser(&local_f0,b);
  do {
    bVar1 = bssl::der::Parser::HasMore(&local_160);
    if (!bVar1) {
      return true;
    }
    bVar1 = bssl::der::Parser::HasMore(&local_f0);
    if (!bVar1) {
      return true;
    }
    bssl::der::Parser::Parser(&local_d8);
    bssl::der::Parser::Parser(&local_48);
    bVar1 = bssl::der::Parser::ReadConstructed(&local_160,0x20000011,&local_d8);
    if (!bVar1) {
      return false;
    }
    bVar1 = bssl::der::Parser::ReadConstructed(&local_f0,0x20000011,&local_48);
    if (!bVar1) {
      return false;
    }
    local_1b8.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar1 = ReadRdn(&local_d8,&local_1b8);
    if (bVar1) {
      bVar1 = ReadRdn(&local_48,&local_218);
      if (bVar1) {
        if ((long)local_1b8.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1b8.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
            (long)local_218.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_218.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          bVar1 = true;
          if (local_1b8.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_1b8.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_168 = local_1b8.
                        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            pXVar4 = local_1b8.
                     super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              __dest = local_218.
                       super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (local_218.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_218.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_004b8fed;
              do {
                bVar2 = bssl::der::operator==
                                  ((Input)(pXVar4->type).data_,(Input)(__dest->type).data_);
                if (bVar2) {
                  local_128 = (pXVar4->value).data_.size_;
                  local_148 = (pXVar4->type).data_.data_;
                  sStack_140 = (pXVar4->type).data_.size_;
                  local_138 = *(undefined8 *)&pXVar4->value_tag;
                  puStack_130 = (pXVar4->value).data_.data_;
                  local_198 = (__dest->type).data_.data_;
                  sStack_190 = (__dest->type).data_.size_;
                  local_188 = *(undefined8 *)&__dest->value_tag;
                  puStack_180 = (__dest->value).data_.data_;
                  local_178 = (__dest->value).data_.size_;
                  local_118 = local_148;
                  sStack_110 = sStack_140;
                  local_108 = local_138;
                  puStack_100 = puStack_130;
                  local_f8 = local_128;
                  local_78 = local_198;
                  sStack_70 = sStack_190;
                  local_68 = local_188;
                  puStack_60 = puStack_180;
                  local_58 = local_178;
                  if (((((uint)local_138 < 0x1f) &&
                       ((0x50481000U >> ((uint)local_138 & 0x1f) & 1) != 0)) &&
                      ((uint)local_188 < 0x1f)) &&
                     ((0x50481000U >> ((uint)local_188 & 0x1f) & 1) != 0)) {
                    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                    local_1d8._M_string_length = 0;
                    local_1d8.field_2._M_local_buf[0] = '\0';
                    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                    local_1f8._M_string_length = 0;
                    local_1f8.field_2._M_local_buf[0] = '\0';
                    CertErrors::CertErrors(&local_90);
                    attribute.type.data_.size_ = sStack_140;
                    attribute.type.data_.data_ = local_148;
                    attribute._16_8_ = local_138;
                    attribute.value.data_.data_ = puStack_130;
                    attribute.value.data_.size_ = local_128;
                    bVar2 = NormalizeValue(attribute,&local_1d8,&local_90);
                    if ((bVar2) &&
                       ((attribute_00.type.data_.size_ = sStack_190,
                        attribute_00.type.data_.data_ = local_198, attribute_00._16_8_ = local_188,
                        attribute_00.value.data_.data_ = puStack_180,
                        attribute_00.value.data_.size_ = local_178,
                        bVar2 = NormalizeValue(attribute_00,&local_1f8,&local_90), bVar2 &&
                        (local_1d8._M_string_length == local_1f8._M_string_length)))) {
                      if (local_1d8._M_string_length == 0) {
                        bVar2 = true;
                      }
                      else {
                        iVar3 = bcmp(local_1d8._M_dataplus._M_p,local_1f8._M_dataplus._M_p,
                                     local_1d8._M_string_length);
                        bVar2 = iVar3 == 0;
                      }
                    }
                    else {
                      bVar2 = false;
                    }
                    CertErrors::~CertErrors(&local_90);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                      operator_delete(local_1f8._M_dataplus._M_p,
                                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                               local_1f8.field_2._M_local_buf[0]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                      operator_delete(local_1d8._M_dataplus._M_p,
                                      CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                               local_1d8.field_2._M_local_buf[0]) + 1);
                    }
                    if (bVar2) break;
                  }
                  else if (((uint)local_138 == (uint)local_188) &&
                          (bVar2 = bssl::der::operator==
                                             ((Input)(pXVar4->value).data_,
                                              (Input)(__dest->value).data_), bVar2)) break;
                }
                __dest = __dest + 1;
              } while (__dest != local_218.
                                 super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
              if (__dest == local_218.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_004b8fed;
              __src = __dest + 1;
              if (__src != local_218.
                           super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
                memmove(__dest,__src,
                        (long)local_218.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
              }
              local_218.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_218.
                   super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              pXVar4 = pXVar4 + 1;
            } while (pXVar4 != local_168);
          }
        }
        else {
LAB_004b8fed:
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
      }
      if (local_218.
          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_218.
                        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_218.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar1 = false;
    }
    if (local_1b8.
        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.
                      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b8.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool VerifyNameMatchInternal(der::Input a, der::Input b,
                             NameMatchType match_type) {
  // Empty Names are allowed.  RFC 5280 section 4.1.2.4 requires "The issuer
  // field MUST contain a non-empty distinguished name (DN)", while section
  // 4.1.2.6 allows for the Subject to be empty in certain cases. The caller is
  // assumed to have verified those conditions.

  // RFC 5280 section 7.1:
  // Two distinguished names DN1 and DN2 match if they have the same number of
  // RDNs, for each RDN in DN1 there is a matching RDN in DN2, and the matching
  // RDNs appear in the same order in both DNs.

  // As an optimization, first just compare the number of RDNs:
  der::Parser a_rdn_sequence_counter(a);
  der::Parser b_rdn_sequence_counter(b);
  while (a_rdn_sequence_counter.HasMore() && b_rdn_sequence_counter.HasMore()) {
    if (!a_rdn_sequence_counter.SkipTag(CBS_ASN1_SET) ||
        !b_rdn_sequence_counter.SkipTag(CBS_ASN1_SET)) {
      return false;
    }
  }
  // If doing exact match and either of the sequences has more elements than the
  // other, not a match. If doing a subtree match, the first Name may have more
  // RDNs than the second.
  if (b_rdn_sequence_counter.HasMore()) {
    return false;
  }
  if (match_type == EXACT_MATCH && a_rdn_sequence_counter.HasMore()) {
    return false;
  }

  // Verify that RDNs in |a| and |b| match.
  der::Parser a_rdn_sequence(a);
  der::Parser b_rdn_sequence(b);
  while (a_rdn_sequence.HasMore() && b_rdn_sequence.HasMore()) {
    der::Parser a_rdn, b_rdn;
    if (!a_rdn_sequence.ReadConstructed(CBS_ASN1_SET, &a_rdn) ||
        !b_rdn_sequence.ReadConstructed(CBS_ASN1_SET, &b_rdn)) {
      return false;
    }
    if (!VerifyRdnMatch(&a_rdn, &b_rdn)) {
      return false;
    }
  }

  return true;
}